

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O2

void __thiscall
Js::StackScriptFunction::BoxState::BoxNativeFrame
          (BoxState *this,JavascriptStackWalker *walker,FunctionBody *callerFunctionBody)

{
  ImplicitCallFlags *pIVar1;
  bool bVar2;
  FunctionBody *this_00;
  ScriptContext *pSVar3;
  void **ppvVar4;
  StackScriptFunction *obj;
  StackScriptFunction *scriptFunction;
  BoxState *this_01;
  IRecyclerVisitedObject this_02;
  FunctionBody *local_48;
  FrameDisplay *stackFrameDisplay;
  Var *boxedScopeSlots;
  Var *stackScopeSlots;
  
  this_02._vptr_IRecyclerVisitedObject = (_func_int **)this;
  if ((walker->field_0x50 & 1) == 0) {
    ppvVar4 = JavascriptStackWalker::GetCurrentArgv(walker);
    this_02._vptr_IRecyclerVisitedObject =
         *(_func_int ***)
          ((long)ppvVar4 +
          ((ulong)((callerFunctionBody->super_ParseableFunctionInfo).m_inParamCount == 0) << 3 |
          0xffffffffffffffe0));
    while (this_02._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
      obj = VarTo<Js::StackScriptFunction>(this_02._vptr_IRecyclerVisitedObject);
      scriptFunction = VarTo<Js::StackScriptFunction,Js::ScriptFunction>(&obj->super_ScriptFunction)
      ;
      bVar2 = NeedBoxScriptFunction(this,&scriptFunction->super_ScriptFunction);
      if (bVar2) {
        BoxStackFunction(this,&scriptFunction->super_ScriptFunction);
      }
      this_02._vptr_IRecyclerVisitedObject =
           obj[1].super_ScriptFunction.super_ScriptFunctionBase.super_JavascriptFunction.
           super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
    }
  }
  this_00 = (FunctionBody *)
            GetFrameDisplayFromNativeFrame
                      ((BoxState *)this_02._vptr_IRecyclerVisitedObject,walker,callerFunctionBody);
  local_48 = this_00;
  bVar2 = ThreadContext::IsOnStack(this_00);
  if (bVar2) {
    boxedScopeSlots = (Var *)0x0;
    this_00 = (FunctionBody *)&this->boxedValues;
    bVar2 = JsUtil::
            BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<Js::FrameDisplay*>
                      ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this_00,(FrameDisplay **)&local_48,&boxedScopeSlots);
    if (bVar2) {
      SetFrameDisplayFromNativeFrame
                ((BoxState *)this_00,walker,callerFunctionBody,(FrameDisplay *)boxedScopeSlots);
      this_00 = callerFunctionBody;
      pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)callerFunctionBody);
      pIVar1 = &pSVar3->threadContext->implicitCallFlags;
      *pIVar1 = *pIVar1 | ImplicitCall_Accessor;
    }
  }
  boxedScopeSlots = GetScopeSlotsFromNativeFrame((BoxState *)this_00,walker,callerFunctionBody);
  bVar2 = ThreadContext::IsOnStack(boxedScopeSlots);
  if (bVar2) {
    stackFrameDisplay = (FrameDisplay *)0x0;
    this_01 = (BoxState *)&this->boxedValues;
    bVar2 = JsUtil::
            BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void**>
                      ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this_01,&boxedScopeSlots,&stackFrameDisplay);
    if (bVar2) {
      SetScopeSlotsFromNativeFrame(this_01,walker,callerFunctionBody,(Var *)stackFrameDisplay);
      pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)callerFunctionBody);
      pIVar1 = &pSVar3->threadContext->implicitCallFlags;
      *pIVar1 = *pIVar1 | ImplicitCall_Accessor;
    }
  }
  return;
}

Assistant:

void StackScriptFunction::BoxState::BoxNativeFrame(JavascriptStackWalker const& walker, FunctionBody * callerFunctionBody)
    {
        this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, [&](ScriptFunction *curr)
        {
            StackScriptFunction * func = VarTo<StackScriptFunction>(curr);
            // Need to check if we need the script function as the list of script function
            // include inlinee stack function that doesn't necessary need to be boxed
            if (this->NeedBoxScriptFunction(func))
            {
                // Box the stack function, even if they might not be "created" in the byte code yet.
                // Some of them will not be captured in slots, so we just need to box them and record it with the
                // stack func so that when we can just use the boxed value when we need it.
                this->BoxStackFunction(func);
            }
        });

        // Write back the boxed stack closure pointers at the designated stack locations.
        Js::FrameDisplay *stackFrameDisplay = this->GetFrameDisplayFromNativeFrame(walker, callerFunctionBody);
        if (ThreadContext::IsOnStack(stackFrameDisplay))
        {
            Js::FrameDisplay *boxedFrameDisplay = nullptr;
            if (boxedValues.TryGetValue(stackFrameDisplay, (void**)&boxedFrameDisplay))
            {
                this->SetFrameDisplayFromNativeFrame(walker, callerFunctionBody, boxedFrameDisplay);
                callerFunctionBody->GetScriptContext()->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);
            }
        }

        Var              *stackScopeSlots = this->GetScopeSlotsFromNativeFrame(walker, callerFunctionBody);
        if (ThreadContext::IsOnStack(stackScopeSlots))
        {
            Var              *boxedScopeSlots = nullptr;
            if (boxedValues.TryGetValue(stackScopeSlots, (void**)&boxedScopeSlots))
            {
                this->SetScopeSlotsFromNativeFrame(walker, callerFunctionBody, boxedScopeSlots);
                callerFunctionBody->GetScriptContext()->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);
            }
        }
    }